

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

ForkedPromise<void> * __thiscall
kj::_::NullableValue<kj::ForkedPromise<void>>::emplace<kj::ForkedPromise<void>>
          (NullableValue<kj::ForkedPromise<void>> *this,ForkedPromise<void> *params)

{
  ForkedPromise<void> *params_00;
  ForkedPromise<void> *params_local;
  NullableValue<kj::ForkedPromise<void>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::ForkedPromise<void>>)0x0;
    dtor<kj::ForkedPromise<void>>((ForkedPromise<void> *)(this + 8));
  }
  params_00 = fwd<kj::ForkedPromise<void>>(params);
  ctor<kj::ForkedPromise<void>,kj::ForkedPromise<void>>((ForkedPromise<void> *)(this + 8),params_00)
  ;
  *this = (NullableValue<kj::ForkedPromise<void>>)0x1;
  return (ForkedPromise<void> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }